

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_data_set_int64
                (oonf_layer2_data *l2data,oonf_layer2_origin *origin,oonf_layer2_metadata *meta,
                int64_t integer,uint64_t scaling)

{
  _Bool _Var1;
  undefined1 local_58 [8];
  oonf_layer2_value value;
  uint64_t scaling_local;
  int64_t integer_local;
  oonf_layer2_metadata *meta_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_data *l2data_local;
  undefined *local_10;
  
  local_58 = (undefined1  [8])0x0;
  value.integer = 0;
  value._8_8_ = 0;
  integer_local = (int64_t)meta;
  value._16_8_ = scaling;
  scaling_local = integer;
  meta_local = (oonf_layer2_metadata *)origin;
  origin_local = (oonf_layer2_origin *)l2data;
  if (meta == (oonf_layer2_metadata *)0x0) {
    if (l2data->_meta == (oonf_layer2_metadata *)0x0) {
      local_10 = &log_global_mask;
      l2data_local._4_4_ = _oonf_layer2_subsystem.logging;
      l2data_local._0_4_ = 8;
      if (((&log_global_mask)[_oonf_layer2_subsystem.logging] & 8) != 0) {
        oonf_log(8,_oonf_layer2_subsystem.logging,"src/base/oonf_layer2.c",0x176,0,0,
                 "Tried to set layer2 data without metadata (origin: %s)",origin->name);
        abort();
      }
    }
    integer_local = (int64_t)l2data->_meta;
  }
  local_58 = (undefined1  [8])integer;
  if (scaling != 0) {
    if (*(ulong *)(integer_local + 0x20) < scaling) {
      local_58 = (undefined1  [8])((ulong)integer / (scaling / *(ulong *)(integer_local + 0x20)));
    }
    else {
      local_58 = (undefined1  [8])(integer * (*(ulong *)(integer_local + 0x20) / scaling));
    }
  }
  _Var1 = oonf_layer2_data_set
                    (l2data,origin,(oonf_layer2_metadata *)integer_local,
                     (oonf_layer2_value *)local_58);
  return _Var1;
}

Assistant:

bool
oonf_layer2_data_set_int64(struct oonf_layer2_data *l2data, const struct oonf_layer2_origin *origin,
    const struct oonf_layer2_metadata *meta, int64_t integer, uint64_t scaling) {
  union oonf_layer2_value value = { 0 };

  if (meta == NULL) {
    OONF_ASSERT(l2data->_meta != NULL, LOG_LAYER2, "Tried to set layer2 data without metadata (origin: %s)", origin->name);
    meta = l2data->_meta;
  }
  if (scaling == 0) {
    value.integer = integer;
  }
  else if (scaling > meta->scaling) {
    value.integer = integer / (scaling / meta->scaling);
  }
  else {
    value.integer = integer * (meta->scaling / scaling);
  }

  return oonf_layer2_data_set(l2data, origin, meta, &value);
}